

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall gflags::FlagSaverImpl::RestoreToRegistry(FlagSaverImpl *this)

{
  CommandLineFlag *this_00;
  Mutex *this_01;
  pointer ppCVar1;
  
  this_01 = &this->main_registry_->lock_;
  gflags_mutex_namespace::Mutex::Lock(this_01);
  for (ppCVar1 = (this->backup_registry_).
                 super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->backup_registry_).
      super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    this_00 = anon_unknown_2::FlagRegistry::FindFlagLocked(this->main_registry_,(*ppCVar1)->name_);
    if (this_00 != (CommandLineFlag *)0x0) {
      anon_unknown_2::CommandLineFlag::CopyFrom(this_00,*ppCVar1);
    }
  }
  gflags_mutex_namespace::Mutex::Unlock(this_01);
  return;
}

Assistant:

void RestoreToRegistry() {
    FlagRegistryLock frl(main_registry_);
    vector<CommandLineFlag*>::const_iterator it;
    for (it = backup_registry_.begin(); it != backup_registry_.end(); ++it) {
      CommandLineFlag* main = main_registry_->FindFlagLocked((*it)->name());
      if (main != NULL) {       // if NULL, flag got deleted from registry(!)
        main->CopyFrom(**it);
      }
    }
  }